

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcEquipmentStandard::~IfcEquipmentStandard(IfcEquipmentStandard *this)

{
  ~IfcEquipmentStandard
            ((IfcEquipmentStandard *)
             (&(this->super_IfcControl).super_IfcObject.field_0x0 +
             *(long *)(*(long *)&(this->super_IfcControl).super_IfcObject + -0x18)));
  return;
}

Assistant:

IfcEquipmentStandard() : Object("IfcEquipmentStandard") {}